

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteBlockDecl(BinaryWriter *this,BlockDeclaration *decl)

{
  pointer pTVar1;
  uint32_t value;
  uint uVar2;
  Type type;
  
  if ((int)((ulong)((long)(decl->sig).param_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(decl->sig).param_types.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) == 0) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (uint)((ulong)((long)(decl->sig).result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_finish - (long)pTVar1) >> 3);
    if (uVar2 < 2) {
      if (uVar2 == 0) {
        type.enum_ = Void;
        type.type_index_ = 0;
      }
      else {
        type = *pTVar1;
      }
      WriteType(this->stream_,type,(char *)0x0);
      return;
    }
  }
  if (decl->has_func_type == true) {
    value = Module::GetFuncTypeIndex(this->module_,&decl->type_var);
  }
  else {
    value = Module::GetFuncTypeIndex(this->module_,&decl->sig);
  }
  if (value != 0xffffffff) {
    if (this->options_->relocatable == true) {
      AddReloc(this,TypeIndexLEB,value);
      WriteFixedS32Leb128(this->stream_,value,"block type function index");
      return;
    }
    WriteS32Leb128(this->stream_,value,"block type function index");
    return;
  }
  __assert_fail("index != kInvalidIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer.cc"
                ,0x21b,
                "void wabt::(anonymous namespace)::BinaryWriter::WriteBlockDecl(const BlockDeclaration &)"
               );
}

Assistant:

void BinaryWriter::WriteBlockDecl(const BlockDeclaration& decl) {
  if (decl.sig.GetNumParams() == 0 && decl.sig.GetNumResults() <= 1) {
    if (decl.sig.GetNumResults() == 0) {
      WriteType(stream_, Type::Void);
    } else if (decl.sig.GetNumResults() == 1) {
      WriteType(stream_, decl.sig.GetResultType(0));
    }
    return;
  }

  Index index = decl.has_func_type ? module_->GetFuncTypeIndex(decl.type_var)
                                   : module_->GetFuncTypeIndex(decl.sig);
  assert(index != kInvalidIndex);
  WriteS32Leb128WithReloc(index, "block type function index",
                          RelocType::TypeIndexLEB);
}